

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ans_byte.hpp
# Opt level: O3

ans_byte_decode * ans_byte_decode::load(ans_byte_decode *__return_storage_ptr__,uint8_t *in_u8)

{
  pointer pdVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined8 uVar4;
  undefined8 uVar5;
  byte bVar6;
  uint64_t uVar7;
  long lVar8;
  ulong uVar9;
  uint uVar10;
  uint8_t *puVar11;
  uint16_t uVar12;
  ushort uVar13;
  undefined1 auVar14 [32];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 extraout_var [56];
  undefined1 in_XMM6 [16];
  bit_stream local_70;
  
  memset(__return_storage_ptr__,0,0x400);
  local_70.first_ptr = local_70.buf;
  local_70.last_ptr = local_70.buf + 1;
  local_70.of = (uint32_t *)(in_u8 + 4);
  (__return_storage_ptr__->table).super__Vector_base<dec_entry,_std::allocator<dec_entry>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_70.write_mode = false;
  local_70.in_word_offset = '\0';
  local_70.bytes_written = 0;
  (__return_storage_ptr__->table).super__Vector_base<dec_entry,_std::allocator<dec_entry>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->table).super__Vector_base<dec_entry,_std::allocator<dec_entry>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_70.buf[0] = *(uint32_t *)in_u8;
  local_70.bytes_consumed = 4;
  local_70.cur_ptr = local_70.first_ptr;
  interpolative_internal::decode_interpolative
            (&local_70,(uint32_t *)__return_storage_ptr__,0x100,1,0x1101);
  if ((local_70.write_mode == true) && (local_70.in_word_offset != '\0')) {
    *local_70.of = *local_70.first_ptr;
  }
  auVar15 = vpbroadcastd_avx512f(ZEXT416((__return_storage_ptr__->nfreqs)._M_elems[0]));
  auVar16 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
  auVar17 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
  auVar18 = vpbroadcastq_avx512f(ZEXT816(0xff));
  lVar8 = 0;
  do {
    auVar19 = vpbroadcastq_avx512f();
    auVar20 = vporq_avx512f(auVar19,auVar16);
    auVar19 = vporq_avx512f(auVar19,auVar17);
    uVar4 = vpcmpuq_avx512f(auVar19,auVar18,1);
    uVar5 = vpcmpuq_avx512f(auVar20,auVar18,1);
    bVar6 = (byte)uVar5;
    uVar13 = CONCAT11(bVar6,(byte)uVar4);
    auVar19 = vmovdqu32_avx512f(*(undefined1 (*) [64])
                                 ((__return_storage_ptr__->nfreqs)._M_elems + lVar8 + 1));
    auVar20._4_4_ = (uint)((byte)(uVar13 >> 1) & 1) * auVar19._4_4_;
    auVar20._0_4_ = (uint)((byte)uVar4 & 1) * auVar19._0_4_;
    auVar20._8_4_ = (uint)((byte)(uVar13 >> 2) & 1) * auVar19._8_4_;
    auVar20._12_4_ = (uint)((byte)(uVar13 >> 3) & 1) * auVar19._12_4_;
    auVar20._16_4_ = (uint)((byte)(uVar13 >> 4) & 1) * auVar19._16_4_;
    auVar20._20_4_ = (uint)((byte)(uVar13 >> 5) & 1) * auVar19._20_4_;
    auVar20._24_4_ = (uint)((byte)(uVar13 >> 6) & 1) * auVar19._24_4_;
    auVar20._28_4_ = (uint)((byte)(uVar13 >> 7) & 1) * auVar19._28_4_;
    auVar20._32_4_ = (uint)(bVar6 & 1) * auVar19._32_4_;
    auVar20._36_4_ = (uint)(bVar6 >> 1 & 1) * auVar19._36_4_;
    auVar20._40_4_ = (uint)(bVar6 >> 2 & 1) * auVar19._40_4_;
    auVar20._44_4_ = (uint)(bVar6 >> 3 & 1) * auVar19._44_4_;
    auVar20._48_4_ = (uint)(bVar6 >> 4 & 1) * auVar19._48_4_;
    auVar20._52_4_ = (uint)(bVar6 >> 5 & 1) * auVar19._52_4_;
    auVar20._56_4_ = (uint)(bVar6 >> 6 & 1) * auVar19._56_4_;
    auVar20._60_4_ = (uint)(bVar6 >> 7) * auVar19._60_4_;
    auVar15 = valignd_avx512f(auVar20,auVar15,0xf);
    auVar15 = vpternlogq_avx512f(auVar15,auVar15,auVar15,0xf);
    auVar15 = vpaddd_avx512f(auVar20,auVar15);
    auVar15 = vmovdqu32_avx512f(auVar15);
    *(undefined1 (*) [64])((__return_storage_ptr__->nfreqs)._M_elems + lVar8 + 1) = auVar15;
    lVar8 = lVar8 + 0x10;
    auVar15 = vmovdqa64_avx512f(auVar20);
  } while (lVar8 != 0x100);
  auVar15 = ZEXT1664((undefined1  [16])0x0);
  lVar8 = 0;
  do {
    auVar16 = vpmovzxdq_avx512f(*(undefined1 (*) [32])
                                 ((__return_storage_ptr__->nfreqs)._M_elems + lVar8));
    lVar8 = lVar8 + 8;
    auVar15 = vpaddq_avx512f(auVar15,auVar16);
  } while (lVar8 != 0x100);
  auVar14 = vextracti64x4_avx512f(auVar15,1);
  auVar15 = vpaddq_avx512f(auVar15,ZEXT3264(auVar14));
  auVar2 = vpaddq_avx(auVar15._0_16_,auVar15._16_16_);
  auVar3 = vpshufd_avx(auVar2,0xee);
  auVar2 = vpaddq_avx(auVar2,auVar3);
  uVar7 = auVar2._0_8_;
  __return_storage_ptr__->frame_size = uVar7;
  auVar2 = vcvtusi2sd_avx512f(in_XMM6,uVar7);
  __return_storage_ptr__->frame_mask = uVar7 - 1;
  auVar15._0_8_ = log2(auVar2._0_8_);
  auVar15._8_56_ = extraout_var;
  uVar7 = vcvttsd2usi_avx512f(auVar15._0_16_);
  __return_storage_ptr__->frame_log2 = uVar7;
  std::vector<dec_entry,_std::allocator<dec_entry>_>::resize
            (&__return_storage_ptr__->table,__return_storage_ptr__->frame_size);
  pdVar1 = (__return_storage_ptr__->table).super__Vector_base<dec_entry,_std::allocator<dec_entry>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar8 = 0;
  uVar9 = 0;
  do {
    uVar10 = (__return_storage_ptr__->nfreqs)._M_elems[lVar8];
    if (uVar10 == 0) {
      uVar10 = 0;
    }
    else {
      uVar12 = 0;
      puVar11 = &pdVar1[uVar9 & 0xffff].sym;
      do {
        ((dec_entry *)(puVar11 + -4))->freq = (uint16_t)uVar10;
        *puVar11 = (uint8_t)lVar8;
        *(uint16_t *)(puVar11 + -2) = uVar12;
        uVar12 = uVar12 + 1;
        puVar11 = puVar11 + 6;
      } while (uVar12 < uVar10);
    }
    uVar9 = (ulong)((int)uVar9 + uVar10);
    lVar8 = lVar8 + 1;
  } while (lVar8 != 0x100);
  __return_storage_ptr__->lower_bound = __return_storage_ptr__->frame_size << 4;
  return __return_storage_ptr__;
}

Assistant:

static ans_byte_decode load(const uint8_t* in_u8)
    {
        ans_byte_decode model;
        auto in_ptr_u32 = reinterpret_cast<const uint32_t*>(in_u8);
        std::array<uint32_t, constants::MAX_SIGMA> efreqs;
        interpolative_internal::decode(in_ptr_u32, model.nfreqs.data(),
            constants::MAX_SIGMA,
            constants::MAX_FRAME_SIZE + constants::MAX_SIGMA);
        uint32_t prev = model.nfreqs[0];
        for (size_t sym = 1; sym < constants::MAX_SIGMA; sym++) {
            auto cur = model.nfreqs[sym];
            model.nfreqs[sym] = cur - prev - 1;
            prev = cur;
        }
        model.frame_size = std::accumulate(
            std::begin(model.nfreqs), std::end(model.nfreqs), 0ULL);
        model.frame_mask = model.frame_size - 1;
        model.frame_log2 = log2(model.frame_size);
        model.table.resize(model.frame_size);
        uint64_t tmp = constants::K * constants::RADIX;
        uint16_t cur_base = 0;
        for (size_t sym = 0; sym < constants::MAX_SIGMA; sym++) {
            auto cur_freq = model.nfreqs[sym];
            for (uint16_t k = 0; k < cur_freq; k++) {
                model.table[cur_base + k].freq = cur_freq;
                model.table[cur_base + k].sym = sym;
                model.table[cur_base + k].offset = k;
            }
            cur_base += model.nfreqs[sym];
        }
        model.lower_bound = constants::K * model.frame_size;
        return model;
    }